

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int accessPayloadChecked(BtCursor *pCur,u32 offset,u32 amt,void *pBuf)

{
  BtCursor *in_RCX;
  char *in_RDI;
  int rc;
  int in_stack_0000004c;
  uchar *in_stack_00000050;
  u32 in_stack_00000058;
  u32 in_stack_0000005c;
  BtCursor *in_stack_00000060;
  undefined4 local_28;
  undefined4 local_4;
  
  if (*in_RDI == '\x01') {
    local_4 = 4;
  }
  else {
    local_28 = btreeRestoreCursorPosition(in_RCX);
    if (local_28 == 0) {
      local_28 = accessPayload(in_stack_00000060,in_stack_0000005c,in_stack_00000058,
                               in_stack_00000050,in_stack_0000004c);
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

static SQLITE_NOINLINE int accessPayloadChecked(
  BtCursor *pCur,
  u32 offset,
  u32 amt,
  void *pBuf
){
  int rc;
  if ( pCur->eState==CURSOR_INVALID ){
    return SQLITE_ABORT;
  }
  assert( cursorOwnsBtShared(pCur) );
  rc = btreeRestoreCursorPosition(pCur);
  return rc ? rc : accessPayload(pCur, offset, amt, pBuf, 0);
}